

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

void __thiscall
pbrt::
InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::InlinedVector(InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *this,InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *other)

{
  undefined8 *in_RSI;
  polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  int local_14;
  
  in_RDI->memoryResource = (memory_resource *)*in_RSI;
  in_RDI[1].memoryResource = (memory_resource *)0x0;
  in_RDI[0x12].memoryResource = (memory_resource *)0x0;
  in_RDI[0x13].memoryResource = (memory_resource *)0x0;
  in_RDI[0x13].memoryResource = (memory_resource *)in_RSI[0x13];
  in_RDI[0x12].memoryResource = (memory_resource *)in_RSI[0x12];
  in_RDI[1].memoryResource = (memory_resource *)in_RSI[1];
  if ((ulong)in_RSI[0x13] < 5) {
    for (local_14 = 0; (ulong)(long)local_14 < (ulong)in_RSI[0x13]; local_14 = local_14 + 1) {
      pstd::pmr::polymorphic_allocator<std::__cxx11::string>::
      construct<std::__cxx11::string,std::__cxx11::string>
                (in_RDI,in_stack_ffffffffffffffd8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x405ba0);
    }
  }
  else {
    in_RSI[0x13] = 0;
  }
  in_RSI[0x12] = 0;
  in_RSI[1] = 0;
  return;
}

Assistant:

InlinedVector(InlinedVector &&other) : alloc(other.alloc) {
        nStored = other.nStored;
        nAlloc = other.nAlloc;
        ptr = other.ptr;
        if (other.nStored <= N)
            for (int i = 0; i < other.nStored; ++i)
                alloc.template construct<T>(fixed + i, std::move(other.fixed[i]));
        // Leave other.nStored as is, so that the detrius left after we
        // moved out of fixed has its destructors run...
        else
            other.nStored = 0;

        other.nAlloc = 0;
        other.ptr = nullptr;
    }